

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd2togif.c
# Opt level: O2

int main(int argc,char **argv)

{
  FILE *pFVar1;
  long lVar2;
  char *__ptr;
  size_t sStack_20;
  
  if (argc == 3) {
    pFVar1 = fopen(argv[1],"rb");
    if (pFVar1 == (FILE *)0x0) {
      __ptr = "Input file does not exist!\n";
      sStack_20 = 0x1b;
    }
    else {
      lVar2 = gdImageCreateFromGd2(pFVar1);
      fclose(pFVar1);
      if (lVar2 != 0) {
        pFVar1 = fopen(argv[2],"wb");
        if (pFVar1 != (FILE *)0x0) {
          gdImageGif(lVar2,pFVar1);
          fclose(pFVar1);
          gdImageDestroy(lVar2);
          return 0;
        }
        fwrite("Output file cannot be written to!\n",0x22,1,_stderr);
        gdImageDestroy(lVar2);
        goto LAB_00101280;
      }
      __ptr = "Input is not in GD2 format!\n";
      sStack_20 = 0x1c;
    }
  }
  else {
    __ptr = "Usage: gd2togif filename.gd2 filename.gif\n";
    sStack_20 = 0x2a;
  }
  fwrite(__ptr,sStack_20,1,_stderr);
LAB_00101280:
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
	gdImagePtr im;
	FILE *in, *out;
	if (argc != 3) {
		fprintf(stderr, "Usage: gd2togif filename.gd2 filename.gif\n");
		exit(1);
	}
	in = fopen(argv[1], "rb");
	if (!in) {
		fprintf(stderr, "Input file does not exist!\n");
		exit(1);
	}
	im = gdImageCreateFromGd2(in);
	fclose(in);
	if (!im) {
		fprintf(stderr, "Input is not in GD2 format!\n");
		exit(1);
	}
	out = fopen(argv[2], "wb");
	if (!out) {
		fprintf(stderr, "Output file cannot be written to!\n");
		gdImageDestroy(im);
		exit(1);
	}
	gdImageGif(im, out);
	fclose(out);
	gdImageDestroy(im);

	return 0;
}